

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alice.cpp
# Opt level: O1

void __thiscall Alice::PermuteProgram(Alice *this)

{
  int iVar1;
  iterator __position;
  long lVar2;
  Server *this_00;
  ostream *poVar3;
  long *plVar4;
  long lVar5;
  long lVar6;
  int j;
  long lVar7;
  undefined1 local_c8 [8];
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  Pi_R_P;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  S;
  long local_88;
  vector<Instruction,_std::allocator<Instruction>_> local_78;
  undefined1 local_60 [8];
  vector<Instruction,_std::allocator<Instruction>_> Temp;
  vector<Instruction,_std::allocator<Instruction>_> V;
  
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            *)local_c8,(long)(this->super_Party).n_p,
           (allocator_type *)
           &Pi_R_P.
            super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            *)&Pi_R_P.
               super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)(this->super_Party).n_p,
           (allocator_type *)
           &Temp.super__Vector_base<Instruction,_std::allocator<Instruction>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage);
  std::vector<Instruction,_std::allocator<Instruction>_>::vector
            ((vector<Instruction,_std::allocator<Instruction>_> *)
             &Temp.super__Vector_base<Instruction,_std::allocator<Instruction>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(long)(this->super_Party).n_p,
             (allocator_type *)local_60);
  std::vector<Instruction,_std::allocator<Instruction>_>::vector
            ((vector<Instruction,_std::allocator<Instruction>_> *)local_60,
             (long)(this->super_Party).n_p,(allocator_type *)&local_78);
  Server::ReceiveProgramVector(&local_78,this->srv);
  std::vector<Instruction,_std::allocator<Instruction>_>::operator=
            ((vector<Instruction,_std::allocator<Instruction>_> *)
             &Temp.super__Vector_base<Instruction,_std::allocator<Instruction>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_78);
  if (local_78.super__Vector_base<Instruction,_std::allocator<Instruction>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<Instruction,_std::allocator<Instruction>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<Instruction,_std::allocator<Instruction>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<Instruction,_std::allocator<Instruction>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<Instruction,std::allocator<Instruction>>::
  _M_assign_aux<__gnu_cxx::__normal_iterator<Instruction*,std::vector<Instruction,std::allocator<Instruction>>>>
            ((vector<Instruction,std::allocator<Instruction>> *)local_60,
             Temp.super__Vector_base<Instruction,_std::allocator<Instruction>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,
             V.super__Vector_base<Instruction,_std::allocator<Instruction>_>._M_impl.
             super__Vector_impl_data._M_start);
  std::
  vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
  ::
  _M_assign_aux<__gnu_cxx::__normal_iterator<std::vector<long,std::allocator<long>>*,std::vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>>>
            ((vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
              *)&Pi_R_P.
                 super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (this->super_Party).P.
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->super_Party).P.
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Permutation Pi_A: ",0x12);
  if (0 < (this->super_Party).n_p) {
    lVar5 = 0;
    lVar6 = 0;
    do {
      poVar3 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cout,
                          (this->super_Party).Pi_P.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar6]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      lVar7 = 0;
      do {
        iVar1 = (this->super_Party).Pi_P.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar6];
        *(undefined8 *)
         (*(long *)&(this->super_Party).P.
                    super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar1].
                    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
         + lVar7) = *(undefined8 *)
                     ((long)Pi_R_P.
                            super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage[lVar6].
                            super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start + lVar7);
        *(undefined8 *)
         ((long)Temp.super__Vector_base<Instruction,_std::allocator<Instruction>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[iVar1].val + lVar7) =
             *(undefined8 *)((long)(long *)local_60 + lVar7 + lVar5);
        plVar4 = (long *)(*(long *)&(this->super_Party).R_P.
                                    super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[lVar6].
                                    super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                    super__Vector_impl_data + lVar7);
        __position._M_current =
             (((pointer)((long)local_c8 + (long)iVar1 * 0x18))->
             super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
        if (__position._M_current ==
            (((pointer)((long)local_c8 + (long)iVar1 * 0x18))->
            super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                    ((vector<long,std::allocator<long>> *)((long)local_c8 + (long)iVar1 * 0x18),
                     __position,plVar4);
        }
        else {
          *__position._M_current = *plVar4;
          *(long **)((vector<long,std::allocator<long>> *)((long)local_c8 + (long)iVar1 * 0x18) + 8)
               = __position._M_current + 1;
        }
        lVar7 = lVar7 + 8;
      } while (lVar7 != 0x28);
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0x28;
    } while (lVar6 < (this->super_Party).n_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\nAlice\'s Permuted Program P_A:\n ",0x20);
  if (0 < (this->super_Party).n_p) {
    lVar6 = 0;
    lVar5 = 0;
    do {
      lVar7 = 0;
      do {
        lVar2 = *(long *)&(this->super_Party).P.
                          super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar5].
                          super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data;
        *(long *)(lVar2 + lVar7 * 8) =
             *(long *)(lVar2 + lVar7 * 8) +
             *(long *)(*(long *)&(this->super_Party).U_P.
                                 super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[lVar5].
                                 super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                 super__Vector_impl_data + lVar7 * 8);
        poVar3 = std::ostream::_M_insert<long>((long)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
        plVar4 = (long *)((long)(Temp.super__Vector_base<Instruction,_std::allocator<Instruction>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage)->val +
                         lVar7 * 8 + lVar6);
        *plVar4 = *plVar4 - ((((pointer)((long)local_c8 + lVar5 * 0x18))->
                             super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                             super__Vector_impl_data._M_start[lVar7] +
                            *(long *)(*(long *)&(this->super_Party).U_P.
                                                super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start[lVar5].
                                                super__Vector_base<long,_std::allocator<long>_>.
                                                _M_impl.super__Vector_impl_data + lVar7 * 8));
        lVar7 = lVar7 + 1;
      } while (lVar7 != 5);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
      std::ostream::put('0');
      std::ostream::flush();
      lVar5 = lVar5 + 1;
      lVar6 = lVar6 + 0x28;
    } while (lVar5 < (this->super_Party).n_p);
  }
  this_00 = this->srv;
  std::vector<Instruction,_std::allocator<Instruction>_>::vector
            ((vector<Instruction,_std::allocator<Instruction>_> *)
             &S.
              super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<Instruction,_std::allocator<Instruction>_> *)
             &Temp.super__Vector_base<Instruction,_std::allocator<Instruction>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  Server::SendProgramVector
            (this_00,(vector<Instruction,_std::allocator<Instruction>_> *)
                     &S.
                      super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(this->super_Party).n_p);
  if (S.
      super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(S.
                    super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    local_88 -
                    (long)S.
                          super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  if (local_60 != (undefined1  [8])0x0) {
    operator_delete((void *)local_60,
                    (long)Temp.super__Vector_base<Instruction,_std::allocator<Instruction>_>._M_impl
                          .super__Vector_impl_data._M_finish - (long)local_60);
  }
  if (Temp.super__Vector_base<Instruction,_std::allocator<Instruction>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(Temp.super__Vector_base<Instruction,_std::allocator<Instruction>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    (long)V.super__Vector_base<Instruction,_std::allocator<Instruction>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)Temp.super__Vector_base<Instruction,_std::allocator<Instruction>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage);
  }
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             *)&Pi_R_P.
                super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             *)local_c8);
  return;
}

Assistant:

void Alice::PermuteProgram()
{
    std::vector<std::vector<long>> Pi_R_P(n_p), S(n_p);
    std::vector<Instruction> V(n_p), Temp(n_p);
    V = srv->ReceiveProgramVector();    //receive Bob's masked share of P
    Temp.assign(V.begin(), V.end());
    S.assign(P.begin(), P.end());
    std::cout<<"Permutation Pi_A: ";
    for(int i=0; i < n_p; i++)
    {
        std::cout<<Pi_P[i]<<" ";
        for(int j=0;  j < 5; j++)
        {
            P[Pi_P[i]][j] = S[i][j]; //Applying Pi on Alice's Share of P
            V[Pi_P[i]].val[j] = Temp[i].val[j]; //Applying Pi on Bob's masked Share of P
            Pi_R_P[Pi_P[i]].push_back(R_P[i][j]);  //Prepping shuffle vector needed for resplit
        }
    }
    std::cout<<"\nAlice's Permuted Program P_A:\n ";
    for(int i=0; i < n_p; i++)
    {
        for(int j=0;  j < 5; j++)
        {
            P[i][j] += U_P[i][j];   //resplitting Alice's share of P
            std::cout<<P[i][j]<<" ";
            V[i].val[j] = V[i].val[j] - Pi_R_P[i][j] - U_P[i][j]; //resplitting Bob's share of P
        }
        std::cout<<std::endl;
    }
    srv->SendProgramVector(V, n_p); //sending Bob's his BlindPermuted share of P
}